

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readCppStyleComment(Reader *this)

{
  Char CVar1;
  Char c;
  Reader *this_local;
  
  while( true ) {
    if (this->current_ == this->end_) {
      return true;
    }
    CVar1 = getNextChar(this);
    if (CVar1 == '\n') break;
    if (CVar1 == '\r') {
      if ((this->current_ != this->end_) && (*this->current_ == '\n')) {
        getNextChar(this);
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool Reader::readCppStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '\n')
      break;
    if (c == '\r') {
      // Consume DOS EOL. It will be normalized in addComment.
      if (current_ != end_ && *current_ == '\n')
        getNextChar();
      // Break on Moc OS 9 EOL.
      break;
    }
  }
  return true;
}